

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4plus.hpp
# Opt level: O1

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,status_type *S)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  uint uVar5;
  wostream *pwVar6;
  ulong uVar7;
  wchar_t local_34;
  wchar_t local_30;
  wchar_t local_2c;
  
  lVar2 = *(long *)out;
  lVar3 = *(long *)(lVar2 + -0x18);
  uVar1 = *(undefined4 *)(out + lVar3 + 0x18);
  *(undefined4 *)(out + lVar3 + 0x18) = 0x26;
  plVar4 = *(long **)(out + *(long *)(lVar2 + -0x18) + 0xf0);
  if (plVar4 != (long *)0x0) {
    local_30 = (**(code **)(*plVar4 + 0x50))(plVar4,0x28);
    pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)out,&local_30,1);
    std::wostream::_M_insert<unsigned_long>((ulong)pwVar6);
    uVar5 = int_math::ceil2<unsigned_int>(0x209);
    if (uVar5 != 0) {
      uVar7 = 0;
      do {
        plVar4 = *(long **)(out + *(long *)(*(long *)out + -0x18) + 0xf0);
        if (plVar4 == (long *)0x0) goto LAB_001f8f74;
        local_34 = (**(code **)(*plVar4 + 0x50))(plVar4,0x20);
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           ((wostream *)out,&local_34,1);
        std::wostream::_M_insert<unsigned_long>((ulong)pwVar6);
        uVar7 = uVar7 + 1;
        uVar5 = int_math::ceil2<unsigned_int>(0x209);
      } while (uVar7 < uVar5);
    }
    plVar4 = *(long **)(out + *(long *)(*(long *)out + -0x18) + 0xf0);
    if (plVar4 != (long *)0x0) {
      local_2c = (**(code **)(*plVar4 + 0x50))(plVar4,0x29);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)out,&local_2c,1);
      *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
      return out;
    }
  }
LAB_001f8f74:
  std::__throw_bad_cast();
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const status_type &S) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << S.index;
        for (unsigned int i{0}; i < S.size(); ++i)
          out << ' ' << S.r[i];
        out << ')';
        out.flags(flags);
        return out;
      }